

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::FindMakeProgram(cmGlobalGenerator *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  ulong uVar2;
  char *pcVar3;
  ostream *poVar4;
  long lVar5;
  bool local_3e9;
  bool local_399;
  allocator local_371;
  string local_370;
  string local_350 [8];
  string saveFile;
  string file;
  string dir;
  string local_2e8;
  undefined1 local_2c8 [8];
  string makeProgram;
  string local_288 [32];
  ostringstream local_268 [8];
  ostringstream err;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string setMakeProgram;
  string local_78;
  allocator local_41;
  string local_40;
  cmMakefile *local_20;
  cmMakefile *mf_local;
  cmGlobalGenerator *this_local;
  
  local_20 = mf;
  mf_local = (cmMakefile *)this;
  uVar2 = std::__cxx11::string::empty();
  pcVar1 = local_20;
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    setMakeProgram.field_2._M_local_buf[0xe] = '\0';
    setMakeProgram.field_2._M_local_buf[0xd] = '\0';
    std::__cxx11::string::string((string *)&local_40,"CMAKE_MAKE_PROGRAM",&local_41);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_40);
    pcVar1 = local_20;
    local_399 = true;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      setMakeProgram.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string
                ((string *)&local_78,"CMAKE_MAKE_PROGRAM",
                 (allocator *)(setMakeProgram.field_2._M_local_buf + 0xf));
      setMakeProgram.field_2._M_local_buf[0xd] = '\x01';
      pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_78);
      local_399 = cmSystemTools::IsOff(pcVar3);
    }
    if ((setMakeProgram.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_78);
    }
    if ((setMakeProgram.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)(setMakeProgram.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    pcVar1 = local_20;
    if (local_399 != false) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::GetModulesFile_abi_cxx11_((string *)local_a0,pcVar1,pcVar3);
      uVar2 = std::__cxx11::string::empty();
      pcVar1 = local_20;
      if ((uVar2 & 1) == 0) {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmMakefile::ReadListFile(pcVar1,pcVar3);
      }
      std::__cxx11::string::~string((string *)local_a0);
    }
    pcVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"CMAKE_MAKE_PROGRAM",&local_c1);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_c0);
    pcVar1 = local_20;
    local_3e9 = true;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,"CMAKE_MAKE_PROGRAM",&local_e9);
      pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_e8);
      local_3e9 = cmSystemTools::IsOff(pcVar3);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    pcVar1 = local_20;
    if (local_3e9 == false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2e8,"CMAKE_MAKE_PROGRAM",
                 (allocator *)(dir.field_2._M_local_buf + 0xf));
      pcVar3 = cmMakefile::GetRequiredDefinition(pcVar1,&local_2e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_2c8,pcVar3,(allocator *)(dir.field_2._M_local_buf + 0xe));
      std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xe));
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xf));
      lVar5 = std::__cxx11::string::find((char)local_2c8,0x20);
      if (lVar5 != -1) {
        std::__cxx11::string::string((string *)(file.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(saveFile.field_2._M_local_buf + 8));
        cmsys::SystemTools::SplitProgramPath
                  ((string *)local_2c8,(string *)(file.field_2._M_local_buf + 8),
                   (string *)(saveFile.field_2._M_local_buf + 8),true);
        std::__cxx11::string::string(local_350,(string *)(saveFile.field_2._M_local_buf + 8));
        cmsys::SystemTools::GetShortPath((string *)local_2c8,(string *)local_2c8);
        cmsys::SystemTools::SplitProgramPath
                  ((string *)local_2c8,(string *)((long)&file.field_2 + 8),
                   (string *)((long)&saveFile.field_2 + 8),true);
        std::__cxx11::string::operator=
                  ((string *)local_2c8,(string *)(file.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_2c8,"/");
        std::__cxx11::string::operator+=((string *)local_2c8,local_350);
        pcVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_370,"CMAKE_MAKE_PROGRAM",&local_371);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddCacheDefinition(pcVar1,&local_370,pcVar3,"make program",FILEPATH,false);
        std::__cxx11::string::~string((string *)&local_370);
        std::allocator<char>::~allocator((allocator<char> *)&local_371);
        std::__cxx11::string::~string(local_350);
        std::__cxx11::string::~string((string *)(saveFile.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
      }
      this_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_2c8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_268);
      poVar4 = std::operator<<((ostream *)local_268,
                               "CMake was unable to find a build program corresponding to \"");
      (*this->_vptr_cmGlobalGenerator[3])(local_288);
      poVar4 = std::operator<<(poVar4,local_288);
      poVar4 = std::operator<<(poVar4,"\".  CMAKE_MAKE_PROGRAM is not set.  You ");
      std::operator<<(poVar4,"probably need to select a different build tool.");
      std::__cxx11::string::~string(local_288);
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error(pcVar3,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)(makeProgram.field_2._M_local_buf + 8));
      cmSystemTools::SetFatalErrorOccured();
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_268);
    }
  }
  else {
    cmSystemTools::Error
              ("Generator implementation error, all generators must specify this->FindMakeProgramFile"
               ,(char *)0x0,(char *)0x0,(char *)0x0);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalGenerator::FindMakeProgram(cmMakefile* mf)
{
  if (this->FindMakeProgramFile.empty()) {
    cmSystemTools::Error(
      "Generator implementation error, "
      "all generators must specify this->FindMakeProgramFile");
    return false;
  }
  if (!mf->GetDefinition("CMAKE_MAKE_PROGRAM") ||
      cmSystemTools::IsOff(mf->GetDefinition("CMAKE_MAKE_PROGRAM"))) {
    std::string setMakeProgram =
      mf->GetModulesFile(this->FindMakeProgramFile.c_str());
    if (!setMakeProgram.empty()) {
      mf->ReadListFile(setMakeProgram.c_str());
    }
  }
  if (!mf->GetDefinition("CMAKE_MAKE_PROGRAM") ||
      cmSystemTools::IsOff(mf->GetDefinition("CMAKE_MAKE_PROGRAM"))) {
    std::ostringstream err;
    err << "CMake was unable to find a build program corresponding to \""
        << this->GetName() << "\".  CMAKE_MAKE_PROGRAM is not set.  You "
        << "probably need to select a different build tool.";
    cmSystemTools::Error(err.str().c_str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  std::string makeProgram = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  // if there are spaces in the make program use short path
  // but do not short path the actual program name, as
  // this can cause trouble with VSExpress
  if (makeProgram.find(' ') != std::string::npos) {
    std::string dir;
    std::string file;
    cmSystemTools::SplitProgramPath(makeProgram, dir, file);
    std::string saveFile = file;
    cmSystemTools::GetShortPath(makeProgram, makeProgram);
    cmSystemTools::SplitProgramPath(makeProgram, dir, file);
    makeProgram = dir;
    makeProgram += "/";
    makeProgram += saveFile;
    mf->AddCacheDefinition("CMAKE_MAKE_PROGRAM", makeProgram.c_str(),
                           "make program", cmStateEnums::FILEPATH);
  }
  return true;
}